

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

bool_t derIsValid2(octet *der,size_t count,u32 tag)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  u32 t;
  size_t len;
  u32 local_34;
  size_t local_30;
  
  sVar2 = derTDec(&local_34,der,count);
  uVar4 = 0;
  if ((sVar2 != 0xffffffffffffffff) && (local_34 == tag)) {
    sVar3 = derLDec(&local_30,der + sVar2,count - sVar2);
    if ((sVar3 != 0xffffffffffffffff) && (uVar4 = 0, sVar2 + sVar3 + local_30 == count)) {
      bVar1 = memIsValid(der + sVar2 + sVar3,local_30);
      uVar4 = (uint)(bVar1 != 0);
    }
  }
  return uVar4;
}

Assistant:

bool_t derIsValid2(const octet der[], size_t count, u32 tag)
{
	size_t t_count;
	size_t l_count;
	u32 t;
	size_t len;
	// обработать T
	t_count = derTDec(&t, der, count);
	if (t_count == SIZE_MAX || t != tag)
		return FALSE;
	// обработать L
	l_count = derLDec(&len, der + t_count, count - t_count);
	if (l_count == SIZE_MAX)
		return FALSE;
	// проверить V
	return count == t_count + l_count + len &&
		memIsValid(der + t_count + l_count, len);
}